

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.h
# Opt level: O0

void __thiscall httpparser::Response::~Response(Response *this)

{
  Response *this_local;
  
  std::__cxx11::string::~string((string *)&this->status);
  std::vector<char,_std::allocator<char>_>::~vector(&this->content);
  std::vector<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>::
  ~vector(&this->headers);
  return;
}

Assistant:

Response()
        : versionMajor(0), versionMinor(0), keepAlive(false), statusCode(0)
    {}